

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

void __thiscall pbrt::syntactic::MappedFile::MappedFile(MappedFile *this,string *fn)

{
  FileMapping *this_00;
  uint8_t *puVar1;
  size_t sVar2;
  
  std::__cxx11::string::string((string *)this,(string *)fn);
  this_00 = &this->file_;
  FileMapping::FileMapping(this_00,fn);
  puVar1 = FileMapping::data(this_00);
  sVar2 = FileMapping::nbytes(this_00);
  (this->data_).ptr = (char *)puVar1;
  (this->data_).count = sVar2;
  this->pos_ = (char *)puVar1;
  return;
}

Assistant:

MappedFile(const std::string &fn)
        : name_(fn)
        , file_(fn)
        , data_(reinterpret_cast<const char*>(file_.data()), file_.nbytes())
        , pos_(data_.cbegin())
      {
      }